

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

ostream * Kernel::operator<<(ostream *out,FuncTerm *self)

{
  PolyNf *pPVar1;
  ostream *out_00;
  char *pcVar2;
  PolyNf *self_00;
  
  operator<<(out,&self->_fun);
  self_00 = (self->_args)._stack;
  pPVar1 = (self->_args)._cursor;
  if (self_00 != pPVar1) {
    pcVar2 = "(";
    do {
      out_00 = std::operator<<(out,pcVar2);
      operator<<(out_00,self_00);
      self_00 = self_00 + 1;
      pcVar2 = ", ";
    } while (self_00 != pPVar1);
    std::operator<<(out,")");
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Kernel::FuncTerm& self) 
{ 
  out << self._fun;
  auto& stack = self._args;
  auto iter = stack.iterFifo();

  if (iter.hasNext()) {
    out << "(" << iter.next();
    while (iter.hasNext()) {
      out << ", " << iter.next();
    }
    out << ")";
  }

  return out;
}